

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lvalue.cpp
# Opt level: O3

void __thiscall
iu_StringSplitLvalue_x_iutest_x_chain_at_first_back_by_stl_str_Test<char>::Body
          (iu_StringSplitLvalue_x_iutest_x_chain_at_first_back_by_stl_str_Test<char> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> re;
  AssertionResult iutest_ar;
  allocator<char> local_261;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_260;
  size_type local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  AssertionHelper local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  AssertionResult local_1d0;
  undefined1 local_1a8 [128];
  ios_base local_128 [264];
  
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"arikitari na_world!","");
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"_ ","");
  paVar1 = &local_240.m_part_result.super_iuCodeMessage.m_message.field_2;
  if (local_260 == &local_250) {
    local_240.m_part_result.super_iuCodeMessage.m_message.field_2._8_4_ = local_250._8_4_;
    local_240.m_part_result.super_iuCodeMessage.m_message.field_2._12_4_ = local_250._12_4_;
    local_240.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_240.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)local_260;
  }
  local_240.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._4_4_ =
       local_250._M_allocated_capacity._4_4_;
  local_240.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._0_4_ =
       local_250._M_allocated_capacity._0_4_;
  local_240.m_part_result.super_iuCodeMessage.m_message._M_string_length = local_258;
  local_258 = 0;
  local_250._M_allocated_capacity._0_4_ = local_250._M_allocated_capacity._0_4_ & 0xffffff00;
  local_260 = &local_250;
  detail::
  split_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false,_true>
  ::operator>><detail::split_at_first_back,_nullptr>
            ((split_helper_subroutine<detail::split_at_first_back,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
              *)local_1a8);
  detail::
  operator|<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_nullptr>
            (&local_1f0,&local_210,
             (split_helper_subroutine<detail::split_at_first_back,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
              *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_240.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_240.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260,
                    CONCAT44(local_250._M_allocated_capacity._4_4_,
                             local_250._M_allocated_capacity._0_4_) + 1);
  }
  local_1a8._0_8_ = "na_world!";
  iutest::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
            (&local_1d0,(internal *)"constant::na_world<char_type>()","re",local_1a8,
             (char **)&local_1f0,in_R9);
  if (local_1d0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_240,local_1d0.m_message._M_dataplus._M_p,&local_261);
    local_240.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_lvalue.cpp"
    ;
    local_240.m_part_result.super_iuCodeMessage.m_line = 0x66;
    local_240.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_240,(Fixed *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_240.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_240.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base(local_128);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0.m_message._M_dataplus._M_p != &local_1d0.m_message.field_2) {
    operator_delete(local_1d0.m_message._M_dataplus._M_p,
                    local_1d0.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringSplitLvalue, chain_at_last_by_c_str)
{
	using char_type = TypeParam;
	const std::basic_string<char_type> s = constant::arikitari_na_world_underscore<char_type>();
	const auto re = s | split(constant::space_underscore<char_type>()) >> at_last();
	IUTEST_ASSERT(2u == re.size());
	IUTEST_ASSERT_EQ(constant::arikitari_na<char_type>(), re[0]);
	IUTEST_ASSERT_EQ(constant::world<char_type>(), re[1]);
}